

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorFunction.cpp
# Opt level: O0

bool ColorFunction::checkCollision(ColorCircle *clr1,ColorCircle *clr2)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dist;
  double y2;
  double y1;
  double x2;
  double x1;
  double threshold;
  double rho2;
  double rho1;
  bool flag_collision;
  ColorCircle *clr2_local;
  ColorCircle *clr1_local;
  
  rho1._7_1_ = false;
  iVar1 = Colored::_state(&clr1->super_Colored);
  if ((iVar1 == 1) && (iVar1 = Colored::_state(&clr2->super_Colored), iVar1 == 1)) {
    (**(clr1->super_Colored)._vptr_Colored)(0);
    (**(clr2->super_Colored)._vptr_Colored)(0);
    x1 = extraout_XMM0_Qa / 5.0;
    if (extraout_XMM0_Qa_00 / 5.0 < x1) {
      x1 = extraout_XMM0_Qa_00 / 5.0;
    }
    if (1.0 < x1) {
      x1 = 1.0;
    }
    if ((extraout_XMM0_Qa < 1.5) && (extraout_XMM0_Qa_00 < 1.5)) {
      x1 = -1.0;
    }
    dVar2 = Colored::_x(&clr1->super_Colored);
    dVar3 = Colored::_x(&clr2->super_Colored);
    dVar4 = Colored::_y(&clr1->super_Colored);
    dVar5 = Colored::_y(&clr2->super_Colored);
    dVar2 = sqrt((dVar5 - dVar4) * (dVar5 - dVar4) + (dVar3 - dVar2) * (dVar3 - dVar2));
    rho1._7_1_ = dVar2 < (extraout_XMM0_Qa + extraout_XMM0_Qa_00) - x1;
  }
  return rho1._7_1_;
}

Assistant:

bool ColorFunction::checkCollision(ColorCircle* clr1, ColorCircle* clr2){
    
    bool flag_collision = false;
    
    if(clr1->_state()==1 && clr2->_state()==1){
        double rho1 = clr1->getRho();
        double rho2 = clr2->getRho();
        
        double threshold = rho1 / 5;
        if( threshold > rho2 / 5){
            threshold = rho2 / 5;
        }
        if( threshold > 1 ){
            threshold = 1;
        }
        
        if(rho1 < 1.5 && rho2 < 1.5){
            threshold = -1;
        }
        
        double x1 = clr1->_x();
        double x2 = clr2->_x();
        double y1 = clr1->_y();
        double y2 = clr2->_y();
        
        double dist = sqrt( (y2 - y1)*(y2 - y1) + (x2 - x1)*(x2 - x1) );
        if( dist < rho1 + rho2 - threshold ){
            flag_collision = true;
            //                printf("(%.2f, %.2f, %.2f, %.2f, %.2f, %.2f, %.2f)\n", x1,y1,x2,y2,rho1,rho2,dist);
        }
    }
    
    return flag_collision;
}